

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O1

void point_based_start(void)

{
  Term_clear();
  display_player_xtra_info(L'\0');
  display_player_stat_info();
  prt("[up/down to move, left/right to modify, \'r\' to reset, \'Enter\' to accept]",
      Term->hgt + L'\xffffffff',Term->wid / 2 + L'\xffffffdc');
  buysell[0] = 0;
  buysell[1] = 0;
  buysell[2] = 0;
  buysell[3] = 0;
  buysell[4] = 0;
  event_add_handler(EVENT_BIRTHPOINTS,point_based_points,(void *)0x0);
  event_add_handler(EVENT_STATS,point_based_stats,(void *)0x0);
  event_add_handler(EVENT_GOLD,point_based_misc,(void *)0x0);
  return;
}

Assistant:

static void point_based_start(void)
{
	const char *prompt = "[up/down to move, left/right to modify, 'r' to reset, 'Enter' to accept]";
	int i;

	/* Clear */
	Term_clear();

	/* Display the player */
	display_player_xtra_info(0);
	display_player_stat_info();

	prt(prompt, Term->hgt - 1, Term->wid / 2 - strlen(prompt) / 2);

	for (i = 0; i < STAT_MAX; ++i) {
		buysell[i] = 0;
	}

	/* Register handlers for various events - cheat a bit because we redraw
	   the lot at once rather than each bit at a time. */
	event_add_handler(EVENT_BIRTHPOINTS, point_based_points, NULL);	
	event_add_handler(EVENT_STATS, point_based_stats, NULL);	
	event_add_handler(EVENT_GOLD, point_based_misc, NULL);	
}